

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::EdgeChainSimplifier::MergeChain
          (EdgeChainSimplifier *this,vector<int,_std::allocator<int>_> *vertices)

{
  pointer *ppiVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_t sVar5;
  size_t sVar6;
  reference this_00;
  EdgeId *pEVar7;
  reference pvVar8;
  ostream *poVar9;
  reference rVar10;
  int32 local_2ac;
  reference local_2a8;
  vector<int,_std::allocator<int>_> *ids_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1_2;
  EdgeId local_27c;
  Iterator local_278;
  EdgeId e_4;
  Iterator __end1_1;
  Iterator __begin1_1;
  VertexOutEdgeIds *__range1_1;
  EdgeId local_254;
  Iterator local_250;
  EdgeId e_3;
  Iterator __end1;
  Iterator __begin1;
  VertexOutEdgeIds *__range1;
  VertexId local_230;
  VertexId vb;
  VertexId v1;
  VertexId v0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_220;
  byte local_211;
  S2LogMessage local_210;
  S2LogMessageVoidify local_1f9;
  reference local_1f8;
  int32 local_1e4;
  Iterator piStack_1e0;
  InputEdgeId id_2;
  Iterator __end3_3;
  Iterator __begin3_3;
  IdSet *local_1b8;
  IdSet *__range3_3;
  Iterator local_1a8;
  EdgeId e_2;
  Iterator __end2_1;
  Iterator __begin2_1;
  VertexOutEdgeIds *__range2_1;
  _Bit_type local_190;
  int32 local_184;
  Iterator piStack_180;
  InputEdgeId id_1;
  Iterator __end3_2;
  Iterator __begin3_2;
  IdSet *local_158;
  IdSet *__range3_2;
  Iterator local_148;
  EdgeId e_1;
  Iterator __end2;
  Iterator __begin2;
  VertexOutEdgeIds *__range2;
  undefined1 auStack_130 [4];
  int j;
  _Bit_type local_128;
  int32 local_11c;
  Iterator piStack_118;
  InputEdgeId id;
  Iterator __end4;
  Iterator __begin4;
  IdSet *local_f0;
  IdSet *__range4;
  Iterator local_e0;
  EdgeId e;
  Iterator __end3_1;
  Iterator __begin3_1;
  VertexOutEdgeIds *__range3_1;
  S2LogMessage local_c0;
  S2LogMessageVoidify local_a9;
  reference local_a8;
  reference local_98;
  vector<int,_std::allocator<int>_> *ids;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range3;
  VertexOutEdgeIds in_edges;
  VertexOutEdgeIds local_60;
  VertexOutEdgeIds out_edges;
  VertexId v1_1;
  VertexId v0_1;
  int i;
  int num_out;
  vector<int,_std::allocator<int>_> degenerate_ids;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  merged_input_ids;
  vector<int,_std::allocator<int>_> *vertices_local;
  EdgeChainSimplifier *this_local;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  v1_1 = 1;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(vertices);
    if (sVar3 <= (ulong)(long)v1_1) {
      bVar2 = std::vector<int,_std::allocator<int>_>::empty((vector<int,_std::allocator<int>_> *)&i)
      ;
      if (!bVar2) {
        local_220._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&i);
        _v1 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i);
        std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (local_220,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_v1)
        ;
        AssignDegenerateEdges
                  (this,(vector<int,_std::allocator<int>_> *)&i,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](vertices,0);
      vb = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](vertices,1);
      local_230 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::back(vertices);
      __range1._4_4_ = *pvVar4;
      ___end1 = Graph::VertexOutMap::edge_ids(&this->out_,vb,local_230);
      e_3 = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1);
      local_250 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1);
      while( true ) {
        bVar2 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e_3,&local_250);
        if (!bVar2) break;
        pEVar7 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_3);
        local_254 = *pEVar7;
        std::pair<int,_int>::pair<int_&,_int_&,_true>
                  ((pair<int,_int> *)((long)&__range1_1 + 4),&vb,(int *)((long)&__range1 + 4));
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&this->new_edges_,(value_type *)((long)&__range1_1 + 4));
        __range1_1._0_4_ = graph_edge_layer(this,local_254);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->new_edge_layers_,(value_type_conflict1 *)&__range1_1);
        Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_3);
      }
      ___end1_1 = Graph::VertexOutMap::edge_ids(&this->out_,local_230,vb);
      e_4 = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1_1);
      local_278 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1_1);
      while( true ) {
        bVar2 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e_4,&local_278);
        if (!bVar2) break;
        pEVar7 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_4);
        local_27c = *pEVar7;
        std::pair<int,_int>::pair<int_&,_int_&,_true>
                  ((pair<int,_int> *)((long)&__range1_2 + 4),(int *)((long)&__range1 + 4),&vb);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&this->new_edges_,(value_type *)((long)&__range1_2 + 4));
        __range1_2._0_4_ = graph_edge_layer(this,local_27c);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->new_edge_layers_,(value_type_conflict1 *)&__range1_2);
        Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_4);
      }
      ppiVar1 = &degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __end1_2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)ppiVar1);
      ids_1 = (vector<int,_std::allocator<int>_> *)
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)ppiVar1);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1_2,
                           (__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                            *)&ids_1);
        if (!bVar2) break;
        local_2a8 = __gnu_cxx::
                    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator*(&__end1_2);
        local_2ac = IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                              (this->input_edge_id_set_lexicon_,local_2a8);
        std::vector<int,_std::allocator<int>_>::push_back(&this->new_input_edge_ids_,&local_2ac);
        __gnu_cxx::
        __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
        ::operator++(&__end1_2);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](vertices,(long)(v1_1 + -1));
    out_edges.end_ = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](vertices,(long)v1_1);
    out_edges.begin_ = *pvVar4;
    local_60 = Graph::VertexOutMap::edge_ids(&this->out_,out_edges.end_,out_edges.begin_);
    register0x00000000 = Graph::VertexOutMap::edge_ids(&this->out_,out_edges.begin_,out_edges.end_);
    if (v1_1 == 1) {
      sVar5 = Graph::VertexOutEdgeIds::size(&local_60);
      sVar6 = Graph::VertexOutEdgeIds::size((VertexOutEdgeIds *)((long)&__range3 + 4));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(long)(int)sVar5 + sVar6);
      ppiVar1 = &degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __end3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)ppiVar1);
      ids = (vector<int,_std::allocator<int>_> *)
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)ppiVar1);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)&ids);
        if (!bVar2) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator*(&__end3);
        local_98 = this_00;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(vertices);
        std::vector<int,_std::allocator<int>_>::reserve(this_00,sVar3 - 1);
        __gnu_cxx::
        __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->is_interior_,(long)out_edges.end_);
      local_a8 = rVar10;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x6bd,kFatal,(ostream *)&std::cerr);
        poVar9 = S2LogMessage::stream(&local_c0);
        poVar9 = std::operator<<(poVar9,"Check failed: is_interior_[v0] ");
        S2LogMessageVoidify::operator&(&local_a9,poVar9);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_c0);
      }
      ___end3_1 = Graph::VertexOutMap::edge_ids(&this->out_,out_edges.end_,out_edges.end_);
      e = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end3_1);
      local_e0 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end3_1);
      while( true ) {
        bVar2 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e,&local_e0);
        if (!bVar2) break;
        pEVar7 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e);
        __range4._4_4_ = *pEVar7;
        Graph::input_edge_ids((IdSet *)&__begin4,this->g_,__range4._4_4_);
        local_f0 = (IdSet *)&__begin4;
        __end4 = IdSetLexicon::IdSet::begin(local_f0);
        piStack_118 = IdSetLexicon::IdSet::end(local_f0);
        for (; __end4 != piStack_118; __end4 = __end4 + 1) {
          local_11c = *__end4;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&i,&local_11c);
        }
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->used_,(long)__range4._4_4_);
        _auStack_130 = rVar10;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_130,true);
        Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e);
      }
    }
    __range2._4_4_ = 0;
    ___end2 = &local_60;
    e_1 = (EdgeId)Graph::VertexOutEdgeIds::begin(___end2);
    local_148 = Graph::VertexOutEdgeIds::end(___end2);
    while( true ) {
      bVar2 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e_1,&local_148);
      if (!bVar2) break;
      pEVar7 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_1);
      __range3_2._4_4_ = *pEVar7;
      Graph::input_edge_ids((IdSet *)&__begin3_2,this->g_,__range3_2._4_4_);
      local_158 = (IdSet *)&__begin3_2;
      __end3_2 = IdSetLexicon::IdSet::begin(local_158);
      piStack_180 = IdSetLexicon::IdSet::end(local_158);
      for (; __end3_2 != piStack_180; __end3_2 = __end3_2 + 1) {
        local_184 = *__end3_2;
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)__range2._4_4_);
        std::vector<int,_std::allocator<int>_>::push_back(pvVar8,&local_184);
      }
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->used_,(long)__range3_2._4_4_);
      local_190 = rVar10._M_mask;
      __range2_1 = (VertexOutEdgeIds *)rVar10._M_p;
      std::_Bit_reference::operator=((_Bit_reference *)&__range2_1,true);
      __range2._4_4_ = __range2._4_4_ + 1;
      Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_1);
    }
    ___end2_1 = (VertexOutEdgeIds *)((long)&__range3 + 4);
    e_2 = (EdgeId)Graph::VertexOutEdgeIds::begin(___end2_1);
    local_1a8 = Graph::VertexOutEdgeIds::end(___end2_1);
    while( true ) {
      bVar2 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e_2,&local_1a8);
      if (!bVar2) break;
      pEVar7 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_2);
      __range3_3._4_4_ = *pEVar7;
      Graph::input_edge_ids((IdSet *)&__begin3_3,this->g_,__range3_3._4_4_);
      local_1b8 = (IdSet *)&__begin3_3;
      __end3_3 = IdSetLexicon::IdSet::begin(local_1b8);
      piStack_1e0 = IdSetLexicon::IdSet::end(local_1b8);
      for (; __end3_3 != piStack_1e0; __end3_3 = __end3_3 + 1) {
        local_1e4 = *__end3_3;
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)__range2._4_4_);
        std::vector<int,_std::allocator<int>_>::push_back(pvVar8,&local_1e4);
      }
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->used_,(long)__range3_3._4_4_);
      local_1f8 = rVar10;
      std::_Bit_reference::operator=(&local_1f8,true);
      __range2._4_4_ = __range2._4_4_ + 1;
      Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_2);
    }
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    local_211 = 0;
    if (sVar3 != (long)__range2._4_4_) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_210,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x6d7,kFatal,(ostream *)&std::cerr);
      local_211 = 1;
      poVar9 = S2LogMessage::stream(&local_210);
      poVar9 = std::operator<<(poVar9,"Check failed: (merged_input_ids.size()) == (j) ");
      S2LogMessageVoidify::operator&(&local_1f9,poVar9);
    }
    if ((local_211 & 1) != 0) break;
    v1_1 = v1_1 + 1;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_210);
}

Assistant:

void S2Builder::EdgeChainSimplifier::MergeChain(
    const vector<VertexId>& vertices) {
  // Suppose that all interior vertices have M outgoing edges and N incoming
  // edges.  Our goal is to group the edges into M outgoing chains and N
  // incoming chains, and then replace each chain by a single edge.
  vector<vector<InputEdgeId>> merged_input_ids;
  vector<InputEdgeId> degenerate_ids;
  int num_out;  // Edge count in the outgoing direction.
  for (int i = 1; i < vertices.size(); ++i) {
    VertexId v0 = vertices[i-1];
    VertexId v1 = vertices[i];
    auto out_edges = out_.edge_ids(v0, v1);
    auto in_edges = out_.edge_ids(v1, v0);
    if (i == 1) {
      // Allocate space to store the input edge ids associated with each edge.
      num_out = out_edges.size();
      merged_input_ids.resize(num_out + in_edges.size());
      for (vector<InputEdgeId>& ids : merged_input_ids) {
        ids.reserve(vertices.size() - 1);
      }
    } else {
      // For each interior vertex, we build a list of input edge ids
      // associated with degenerate edges.  Each input edge ids will be
      // assigned to one of the output edges later.  (Normally there are no
      // degenerate edges at all since most layer types don't want them.)
      S2_DCHECK(is_interior_[v0]);
      for (EdgeId e : out_.edge_ids(v0, v0)) {
        for (InputEdgeId id : g_.input_edge_ids(e)) {
          degenerate_ids.push_back(id);
        }
        used_[e] = true;
      }
    }
    // Because the edges were created in layer order, and all sorts used are
    // stable, the edges are still in layer order.  Therefore we can simply
    // merge together all the edges in the same relative position.
    int j = 0;
    for (EdgeId e : out_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    for (EdgeId e : in_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    S2_DCHECK_EQ(merged_input_ids.size(), j);
  }
  if (!degenerate_ids.empty()) {
    std::sort(degenerate_ids.begin(), degenerate_ids.end());
    AssignDegenerateEdges(degenerate_ids, &merged_input_ids);
  }
  // Output the merged edges.
  VertexId v0 = vertices[0], v1 = vertices[1], vb = vertices.back();
  for (EdgeId e : out_.edge_ids(v0, v1)) {
    new_edges_.push_back(Edge(v0, vb));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (EdgeId e : out_.edge_ids(v1, v0)) {
    new_edges_.push_back(Edge(vb, v0));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (const auto& ids : merged_input_ids) {
    new_input_edge_ids_.push_back(input_edge_id_set_lexicon_->Add(ids));
  }
}